

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O1

RequiredError *
CLI::RequiredError::Subcommand(RequiredError *__return_storage_ptr__,size_t min_subcom)

{
  bool bVar1;
  char cVar2;
  long *plVar3;
  size_t sVar4;
  long *plVar5;
  size_type *psVar6;
  char cVar7;
  _Alloc_hider _Var8;
  string __str;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  uint local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string local_40;
  
  if (min_subcom == 1) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"A subcommand","");
    RequiredError(__return_storage_ptr__,&local_40);
    _Var8._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    cVar7 = '\x01';
    if (9 < min_subcom) {
      sVar4 = min_subcom;
      cVar2 = '\x04';
      do {
        cVar7 = cVar2;
        if (sVar4 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_0010cdbc;
        }
        if (sVar4 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_0010cdbc;
        }
        if (sVar4 < 10000) goto LAB_0010cdbc;
        bVar1 = 99999 < sVar4;
        sVar4 = sVar4 / 10000;
        cVar2 = cVar7 + '\x04';
      } while (bVar1);
      cVar7 = cVar7 + '\x01';
    }
LAB_0010cdbc:
    local_60 = &local_50;
    ::std::__cxx11::string::_M_construct((ulong)&local_60,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_60->_M_local_buf,local_58,min_subcom);
    plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1176b9);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_90 = *plVar5;
      lStack_88 = plVar3[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar5;
      local_a0 = (long *)*plVar3;
    }
    local_98 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::append((char *)&local_a0);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_80.field_2._M_allocated_capacity = *psVar6;
      local_80.field_2._8_8_ = plVar3[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar6;
      local_80._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_80._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    RequiredError(__return_storage_ptr__,&local_80,RequiredError);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    _Var8._M_p = (pointer)local_60;
    if (local_60 == &local_50) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(_Var8._M_p);
  return __return_storage_ptr__;
}

Assistant:

static RequiredError Subcommand(size_t min_subcom) {
        if(min_subcom == 1)
            return RequiredError("A subcommand");
        else
            return RequiredError("Requires at least " + std::to_string(min_subcom) + " subcommands",
                                 ExitCodes::RequiredError);
    }